

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O2

void __thiscall GibbsSamplerFromHDP::deleteK(GibbsSamplerFromHDP *this,uint k)

{
  uint uVar1;
  pointer puVar2;
  pointer pvVar3;
  long lVar4;
  int j;
  ulong uVar5;
  ulong uVar6;
  
  puVar2 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar5 < this->_J; uVar5 = uVar5 + 1) {
    pvVar3 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar6 = 0; uVar6 < puVar2[uVar5]; uVar6 = uVar6 + 1) {
      lVar4 = *(long *)&pvVar3[uVar5].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      uVar1 = *(uint *)(lVar4 + uVar6 * 4);
      if (k < uVar1) {
        *(uint *)(lVar4 + uVar6 * 4) = uVar1 - 1;
      }
    }
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::erase(&this->_nkv,
          (this->_nkv).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + k);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
            (&this->_nk,
             (const_iterator)
             ((this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + k));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
            (&this->_mk,
             (const_iterator)
             ((this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + k));
  this->_K = this->_K - 1;
  return;
}

Assistant:

void GibbsSamplerFromHDP::deleteK(unsigned int k){//{{{
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            if(_kjt[j][t] > k) _kjt[j][t]--;
        }
    }
    _nkv.erase(_nkv.begin() + k);
    _nk.erase(_nk.begin() + k);
    _mk.erase(_mk.begin() + k);
    _K--;
}